

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_c_api_usecase1.cpp
# Opt level: O0

void call_server1(void)

{
  bool bVar1;
  debug_memory_resource *local_48 [2];
  undefined1 local_38 [8];
  char_array_list data;
  size_t buffer_size;
  char *buffer;
  
  buffer_size = 0;
  data.buffer_.v2_.end = (pointer_type)0x0;
  bVar1 = server_api_call1((char **)&buffer_size,(size_t *)&data.buffer_.v2_.end);
  if (bVar1) {
    local_48[0] = &global_memory_resource;
    iffl::
    flat_forward_list<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,std::pmr::polymorphic_allocator<char>>
    ::flat_forward_list<iffl::debug_memory_resource*>
              ((flat_forward_list<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,std::pmr::polymorphic_allocator<char>>
                *)local_38,buffer_size,data.buffer_.v2_.end,local_48);
    process_data1((char_array_list *)local_38);
    iffl::
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::~flat_forward_list
              ((flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                *)local_38);
  }
  else if ((buffer_size != 0) || (data.buffer_.v2_.end != (pointer_type)0x0)) {
    std::terminate();
  }
  return;
}

Assistant:

void call_server1() {
    char *buffer{ nullptr };
    size_t buffer_size{ 0 };

    if (server_api_call1(&buffer, &buffer_size)) {
        //
        // If server call succeeded the 
        // take ownership of the buffer
        //
        char_array_list data{ iffl::attach_buffer{},
                              buffer, 
                              buffer_size,
                              &global_memory_resource };
        process_data1(data);
    } else {
        FFL_CODDING_ERROR_IF(buffer || buffer_size);
    }
}